

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

llama_tensor_weight * __thiscall llama_model_loader::get_weight(llama_model_loader *this,char *name)

{
  bool bVar1;
  const_iterator this_00;
  pointer ppVar2;
  const_iterator pos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
  *in_stack_ffffffffffffff78;
  _Self local_60 [2];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  _Self local_20 [3];
  llama_tensor_weight *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
            ::find(in_stack_ffffffffffffff78,(key_type *)0x450c22);
  local_20[0]._M_node = this_00._M_node;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight,_llama_model_loader::weight_name_comparer,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>_>
       ::end(this_00._M_node);
  bVar1 = std::operator!=(local_20,local_60);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_llama_model_loader::llama_tensor_weight>_>
                           *)0x450c77);
    local_8 = &ppVar2->second;
  }
  else {
    local_8 = (llama_tensor_weight *)0x0;
  }
  return local_8;
}

Assistant:

const llama_model_loader::llama_tensor_weight * llama_model_loader::get_weight(const char * name) const {
    auto pos = weights_map.find(name);
    if (pos != weights_map.end()) {
        return &pos->second;
    }

    return nullptr;
}